

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  Mutex *__mutex;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  const_iterator __position;
  value_type local_38;
  
  __mutex = &this->budgets_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this_00 = &this->budgets;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      p_Var2 = (_List_node_base *)ncnn::fastMalloc(size);
      pthread_mutex_lock((pthread_mutex_t *)&this->payouts_lock);
      local_38.first = size;
      goto LAB_001113ac;
    }
    p_Var1 = __position._M_node[1]._M_next;
  } while ((p_Var1 < size) || (size < (long)p_Var1 * (ulong)this->size_compare_ratio >> 8));
  p_Var2 = __position._M_node[1]._M_prev;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (this_00,__position);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)&this->payouts_lock);
  local_38.first = (unsigned_long)p_Var1;
LAB_001113ac:
  local_38.second = p_Var2;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&this->payouts,&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->payouts_lock);
  return p_Var2;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    budgets_lock.lock();

    // find free budget
    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            budgets.erase(it);

            budgets_lock.unlock();

            payouts_lock.lock();

            payouts.push_back(std::make_pair(bs, ptr));

            payouts_lock.unlock();

            return ptr;
        }
    }

    budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    payouts_lock.lock();

    payouts.push_back(std::make_pair(size, ptr));

    payouts_lock.unlock();

    return ptr;
}